

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_simd_mod_imm(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  ulong mask;
  uint64_t mask_00;
  bool bVar10;
  bool is_q_00;
  int local_5c;
  int i;
  int shift_1;
  int shift;
  uint64_t imm;
  _Bool is_q;
  _Bool is_neg;
  uint64_t abcdefgh;
  int o2;
  int cmode_0;
  int cmode_3_1;
  int cmode;
  int rd;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar2 = extract32(insn,0,5);
  uVar3 = extract32(insn,0xc,4);
  uVar4 = extract32(uVar3,1,3);
  uVar5 = extract32(uVar3,0,1);
  uVar6 = extract32(insn,0xb,1);
  uVar7 = extract32(insn,5,5);
  uVar8 = extract32(insn,0x10,3);
  uVar9 = uVar7 | uVar8 << 5;
  mask = (ulong)uVar9;
  uVar7 = extract32(insn,0x1d,1);
  bVar10 = uVar7 != 0;
  uVar7 = extract32(insn,0x1e,1);
  is_q_00 = uVar7 != 0;
  _shift_1 = 0;
  if (((uVar6 == 0) && (((uVar3 != 0xf || (!bVar10)) || (is_q_00)))) ||
     (((_Var1 = isar_feature_aa64_fp16(s->isar), _Var1 && (uVar6 != 0)) && (uVar3 == 0xf)))) {
    _Var1 = fp_access_check(s);
    if (_Var1) {
      switch(uVar4) {
      case 0:
      case 1:
      case 2:
      case 3:
        _shift_1 = bitfield_replicate(mask << ((byte)(uVar4 << 3) & 0x3f),0x20);
        break;
      case 4:
      case 5:
        _shift_1 = bitfield_replicate(mask << (sbyte)((uVar4 & 1) << 3),0x10);
        break;
      case 6:
        if (uVar5 == 0) {
          _shift_1 = mask << 8 | 0xff;
        }
        else {
          _shift_1 = mask << 0x10 | 0xffff;
        }
        _shift_1 = bitfield_replicate(_shift_1,0x20);
        break;
      case 7:
        if ((uVar5 != 0) || (bVar10)) {
          if ((uVar5 == 0) && (bVar10)) {
            _shift_1 = 0;
            for (local_5c = 0; local_5c < 8; local_5c = local_5c + 1) {
              if ((mask & 1L << ((byte)local_5c & 0x3f)) != 0) {
                _shift_1 = 0xffL << ((byte)(local_5c << 3) & 0x3f) | _shift_1;
              }
            }
          }
          else if (uVar5 != 0) {
            if (bVar10) {
              _shift_1 = (mask & 0x3f) << 0x30;
              if ((uVar9 & 0x80) != 0) {
                _shift_1 = _shift_1 | 0x8000000000000000;
              }
              if ((uVar9 & 0x40) == 0) {
                _shift_1 = _shift_1 | 0x4000000000000000;
              }
              else {
                _shift_1 = _shift_1 | 0x3fc0000000000000;
              }
            }
            else if (uVar6 == 0) {
              _shift_1 = (mask & 0x3f) << 0x13;
              if ((uVar9 & 0x80) != 0) {
                _shift_1 = _shift_1 | 0x80000000;
              }
              if ((uVar9 & 0x40) == 0) {
                _shift_1 = _shift_1 | 0x40000000;
              }
              else {
                _shift_1 = _shift_1 | 0x3e000000;
              }
              _shift_1 = _shift_1 << 0x20 | _shift_1;
            }
            else {
              mask_00 = vfp_expand_imm_aarch64(1,(uint8_t)uVar9);
              _shift_1 = bitfield_replicate(mask_00,0x10);
            }
          }
        }
        else {
          _shift_1 = bitfield_replicate(mask,8);
        }
        break;
      default:
        fprintf(_stderr,"%s: cmode_3_1: %x\n","disas_simd_mod_imm",(ulong)uVar4);
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                   ,0x1f48,(char *)0x0);
      }
      if ((uVar4 != 7) && (bVar10)) {
        _shift_1 = _shift_1 ^ 0xffffffffffffffff;
      }
      if (((uVar3 & 9) == 1) || ((uVar3 & 0xd) == 9)) {
        if (bVar10) {
          gen_gvec_fn2i(s,is_q_00,uVar2,uVar2,_shift_1,tcg_gen_gvec_andi_aarch64,3);
        }
        else {
          gen_gvec_fn2i(s,is_q_00,uVar2,uVar2,_shift_1,tcg_gen_gvec_ori_aarch64,3);
        }
      }
      else {
        uVar2 = vec_full_reg_offset(s,uVar2);
        uVar3 = 8;
        if (is_q_00) {
          uVar3 = 0x10;
        }
        uVar4 = vec_full_reg_size(s);
        tcg_gen_gvec_dup64i_aarch64(tcg_ctx_00,uVar2,uVar3,uVar4,_shift_1);
      }
    }
  }
  else {
    unallocated_encoding_aarch64(s);
  }
  return;
}

Assistant:

static void disas_simd_mod_imm(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int cmode = extract32(insn, 12, 4);
    int cmode_3_1 = extract32(cmode, 1, 3);
    int cmode_0 = extract32(cmode, 0, 1);
    int o2 = extract32(insn, 11, 1);
    uint64_t abcdefgh = extract32(insn, 5, 5) | (extract32(insn, 16, 3) << 5);
    bool is_neg = extract32(insn, 29, 1);
    bool is_q = extract32(insn, 30, 1);
    uint64_t imm = 0;

    if (o2 != 0 || ((cmode == 0xf) && is_neg && !is_q)) {
        /* Check for FMOV (vector, immediate) - half-precision */
        if (!(dc_isar_feature(aa64_fp16, s) && o2 && cmode == 0xf)) {
            unallocated_encoding(s);
            return;
        }
    }

    if (!fp_access_check(s)) {
        return;
    }

    /* See AdvSIMDExpandImm() in ARM ARM */
    switch (cmode_3_1) {
    case 0: /* Replicate(Zeros(24):imm8, 2) */
    case 1: /* Replicate(Zeros(16):imm8:Zeros(8), 2) */
    case 2: /* Replicate(Zeros(8):imm8:Zeros(16), 2) */
    case 3: /* Replicate(imm8:Zeros(24), 2) */
    {
        int shift = cmode_3_1 * 8;
        imm = bitfield_replicate(abcdefgh << shift, 32);
        break;
    }
    case 4: /* Replicate(Zeros(8):imm8, 4) */
    case 5: /* Replicate(imm8:Zeros(8), 4) */
    {
        int shift = (cmode_3_1 & 0x1) * 8;
        imm = bitfield_replicate(abcdefgh << shift, 16);
        break;
    }
    case 6:
        if (cmode_0) {
            /* Replicate(Zeros(8):imm8:Ones(16), 2) */
            imm = (abcdefgh << 16) | 0xffff;
        } else {
            /* Replicate(Zeros(16):imm8:Ones(8), 2) */
            imm = (abcdefgh << 8) | 0xff;
        }
        imm = bitfield_replicate(imm, 32);
        break;
    case 7:
        if (!cmode_0 && !is_neg) {
            imm = bitfield_replicate(abcdefgh, 8);
        } else if (!cmode_0 && is_neg) {
            int i;
            imm = 0;
            for (i = 0; i < 8; i++) {
                if ((abcdefgh) & (1ULL << i)) {
                    imm |= 0xffULL << (i * 8);
                }
            }
        } else if (cmode_0) {
            if (is_neg) {
                imm = (abcdefgh & 0x3f) << 48;
                if (abcdefgh & 0x80) {
                    imm |= 0x8000000000000000ULL;
                }
                if (abcdefgh & 0x40) {
                    imm |= 0x3fc0000000000000ULL;
                } else {
                    imm |= 0x4000000000000000ULL;
                }
            } else {
                if (o2) {
                    /* FMOV (vector, immediate) - half-precision */
                    imm = vfp_expand_imm(MO_16, abcdefgh);
                    /* now duplicate across the lanes */
                    imm = bitfield_replicate(imm, 16);
                } else {
                    imm = (abcdefgh & 0x3f) << 19;
                    if (abcdefgh & 0x80) {
                        imm |= 0x80000000;
                    }
                    if (abcdefgh & 0x40) {
                        imm |= 0x3e000000;
                    } else {
                        imm |= 0x40000000;
                    }
                    imm |= (imm << 32);
                }
            }
        }
        break;
    default:
        fprintf(stderr, "%s: cmode_3_1: %x\n", __func__, cmode_3_1);
        g_assert_not_reached();
    }

    if (cmode_3_1 != 7 && is_neg) {
        imm = ~imm;
    }

    if (!((cmode & 0x9) == 0x1 || (cmode & 0xd) == 0x9)) {
        /* MOVI or MVNI, with MVNI negation handled above.  */
        tcg_gen_gvec_dup64i(tcg_ctx, vec_full_reg_offset(s, rd), is_q ? 16 : 8,
                            vec_full_reg_size(s), imm);
    } else {
        /* ORR or BIC, with BIC negation to AND handled above.  */
        if (is_neg) {
            gen_gvec_fn2i(s, is_q, rd, rd, imm, tcg_gen_gvec_andi, MO_64);
        } else {
            gen_gvec_fn2i(s, is_q, rd, rd, imm, tcg_gen_gvec_ori, MO_64);
        }
    }
}